

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator>::Lookup
          (PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *this,
          uint *value)

{
  bool bVar1;
  hash_t hVar2;
  int *in_RSI;
  long in_RDI;
  bool bVar3;
  uint64_t offset;
  undefined8 local_18;
  
  hVar2 = Hash<unsigned_int>(0);
  local_18 = hVar2 & *(ulong *)(in_RDI + 0x20);
  while( true ) {
    bVar1 = primitive_dictionary_entry_t::IsEmpty
                      ((primitive_dictionary_entry_t *)(*(long *)(in_RDI + 0x90) + local_18 * 8));
    bVar3 = false;
    if (!bVar1) {
      bVar3 = *(int *)(*(long *)(in_RDI + 0x90) + local_18 * 8) != *in_RSI;
    }
    if (!bVar3) break;
    local_18 = *(ulong *)(in_RDI + 0x20) & local_18 + 1;
  }
  return (primitive_dictionary_entry_t *)(*(long *)(in_RDI + 0x90) + local_18 * 8);
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}